

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float width,float height,float zNear,float zFar,
          bool directX)

{
  undefined3 in_register_00000031;
  Matrix4f *m;
  bool bVar1;
  float fVar2;
  float fVar3;
  
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  fVar3 = 2.0;
  __return_storage_ptr__->m_elements[0] = 2.0 / width;
  __return_storage_ptr__->m_elements[5] = 2.0 / height;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  __return_storage_ptr__->m_elements[0xc] = -1.0;
  __return_storage_ptr__->m_elements[0xd] = -1.0;
  bVar1 = CONCAT31(in_register_00000031,directX) == 0;
  fVar2 = zNear;
  if (bVar1) {
    fVar2 = zNear + zFar;
  }
  if (!bVar1) {
    fVar3 = 1.0;
  }
  __return_storage_ptr__->m_elements[10] = fVar3 / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] = fVar2 / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float width, float height, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / width;
	m( 1, 1 ) = 2.0f / height;
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = -1;
	m( 1, 3 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}